

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
          (KNearestNeighborsClassifier *this)

{
  if (((this->_oneof_case_[2] == 0xd2) || (this->_oneof_case_[2] == 200)) &&
     ((this->WeightingScheme_).uniformweighting_ != (UniformWeighting *)0x0)) {
    (*(((this->WeightingScheme_).uniformweighting_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[2] = 0;
  return;
}

Assistant:

void KNearestNeighborsClassifier::clear_WeightingScheme() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.KNearestNeighborsClassifier)
  switch (WeightingScheme_case()) {
    case kUniformWeighting: {
      delete WeightingScheme_.uniformweighting_;
      break;
    }
    case kInverseDistanceWeighting: {
      delete WeightingScheme_.inversedistanceweighting_;
      break;
    }
    case WEIGHTINGSCHEME_NOT_SET: {
      break;
    }
  }
  _oneof_case_[2] = WEIGHTINGSCHEME_NOT_SET;
}